

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O3

quint32 qFloatDistance(float a,float b)

{
  bool bVar1;
  bool bVar2;
  quint32 qVar3;
  int iVar4;
  float fVar5;
  float b_00;
  float fVar6;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    iVar4 = 0;
    do {
      fVar6 = -b;
      fVar5 = -a;
      b_00 = fVar5;
      if (fVar5 <= a) {
        b_00 = a;
      }
      if (a < fVar5 != fVar6 <= b) {
        fVar5 = (float)(~-(uint)(a < 0.0) & (uint)b | (uint)fVar6 & -(uint)(a < 0.0));
        if (((a != 0.0) || (fVar6 = fVar5, NAN(a))) && ((b != 0.0 || (fVar6 = b_00, NAN(b))))) {
          fVar6 = fVar5;
          if (fVar5 < b_00) {
            fVar6 = b_00;
            b_00 = fVar5;
          }
          fVar6 = (float)((int)fVar6 - (int)b_00);
        }
        goto LAB_00215ded;
      }
      fVar5 = (float)(~-(uint)(a < 0.0) & (uint)fVar6 | -(uint)(a < 0.0) & (uint)b);
      qVar3 = qFloatDistance(0.0,b_00);
      iVar4 = iVar4 + qVar3;
      bVar1 = NAN(b);
      bVar2 = b != 0.0;
      a = 0.0;
      b = fVar5;
    } while ((bVar2) || (bVar1));
  }
  else {
    iVar4 = 0;
  }
  fVar6 = 0.0;
LAB_00215ded:
  return iVar4 + (int)fVar6;
}

Assistant:

Q_CORE_EXPORT quint32 qFloatDistance(float a, float b)
{
    static const quint32 smallestPositiveFloatAsBits = 0x00000001;  // denormalized, (SMALLEST), (1.4E-45)
    /* Assumes:
       * IEE754 format.
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint32) == sizeof(float));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0F, a) + qFloatDistance(0.0F, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return f2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return f2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? f2i(a) - f2i(b) : f2i(b) - f2i(a);
}